

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 (*pauVar1) [12];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [12];
  int i_2;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int i;
  bool bVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar67;
  vfloat4 a;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar113;
  float fVar120;
  uint uVar121;
  float fVar122;
  float fVar131;
  float fVar133;
  Vec3ff v3;
  uint uVar132;
  uint uVar134;
  float fVar135;
  uint uVar136;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar137;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar156;
  float fVar157;
  Vec3fa n1;
  float fVar158;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar165;
  float fVar167;
  vfloat4 a_1;
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar180;
  float fVar181;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar183;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  vfloat4 a0;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  uint uVar205;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar206;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar228;
  float fVar229;
  uint uVar230;
  float fVar231;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_258 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  size_t local_d0;
  size_t local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vec3fa n0;
  
  auVar90 = _DAT_01feb9f0;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = _DAT_01feb9f0;
  auVar105 = _DAT_01feba00;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = _DAT_01feba00;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar90;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar105;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar22 = r->_begin;
  local_d0 = __return_storage_ptr__->end;
  if (uVar22 < r->_end) {
    local_a8 = auVar90;
    local_98 = auVar105;
    local_b8 = k;
    do {
      uVar14 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar22);
      uVar18 = (ulong)uVar14;
      uVar23 = (ulong)(uVar14 + 3);
      pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar23 < (pBVar6->super_RawBufferView).num) {
        uVar15 = (ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar24 = uVar14 + 2;
        pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        fVar122 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .maxRadiusScale;
        bVar26 = false;
        uVar17 = 0;
        do {
          pcVar8 = pBVar6[uVar17].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar6[uVar17].super_RawBufferView.stride;
          lVar20 = sVar9 * uVar18;
          lVar21 = sVar9 * (uVar14 + 1);
          lVar16 = sVar9 * uVar24;
          auVar74._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar21 + 0xc)));
          auVar74._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar20 + 0xc)));
          auVar74._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar16 + 0xc)));
          auVar74._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar23 + 0xc)));
          iVar25 = movmskps(uVar24,auVar74);
          if (iVar25 != 0) {
LAB_00ab3163:
            if (!bVar26) goto LAB_00ab414a;
            break;
          }
          auVar74 = *(undefined1 (*) [16])(pcVar8 + lVar20);
          fVar207 = auVar74._0_4_;
          fVar212 = auVar74._4_4_;
          fVar213 = auVar74._8_4_;
          fVar214 = auVar74._12_4_;
          auVar173._0_4_ = -(uint)(fVar207 < 1.844e+18 && -1.844e+18 < fVar207);
          auVar173._4_4_ = -(uint)(fVar212 < 1.844e+18 && -1.844e+18 < fVar212);
          auVar173._8_4_ = -(uint)(fVar213 < 1.844e+18 && -1.844e+18 < fVar213);
          auVar173._12_4_ = -(uint)(fVar214 < 1.844e+18 && -1.844e+18 < fVar214);
          uVar19 = movmskps((int)lVar20,auVar173);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          auVar74 = *(undefined1 (*) [16])(pcVar8 + lVar21);
          fVar215 = auVar74._0_4_;
          fVar220 = auVar74._4_4_;
          fVar221 = auVar74._8_4_;
          fVar222 = auVar74._12_4_;
          auVar108._0_4_ = -(uint)(fVar215 < 1.844e+18 && -1.844e+18 < fVar215);
          auVar108._4_4_ = -(uint)(fVar220 < 1.844e+18 && -1.844e+18 < fVar220);
          auVar108._8_4_ = -(uint)(fVar221 < 1.844e+18 && -1.844e+18 < fVar221);
          auVar108._12_4_ = -(uint)(fVar222 < 1.844e+18 && -1.844e+18 < fVar222);
          uVar19 = movmskps(CONCAT31((int3)((uint)uVar19 >> 8),~(byte)uVar19),auVar108);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          auVar74 = *(undefined1 (*) [16])(pcVar8 + lVar16);
          fVar106 = auVar74._0_4_;
          fVar114 = auVar74._4_4_;
          fVar116 = auVar74._8_4_;
          fVar118 = auVar74._12_4_;
          auVar139._0_4_ = -(uint)(fVar106 < 1.844e+18 && -1.844e+18 < fVar106);
          auVar139._4_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
          auVar139._8_4_ = -(uint)(fVar116 < 1.844e+18 && -1.844e+18 < fVar116);
          auVar139._12_4_ = -(uint)(fVar118 < 1.844e+18 && -1.844e+18 < fVar118);
          uVar19 = movmskps((int)lVar16,auVar139);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          auVar74 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar23);
          fVar120 = auVar74._0_4_;
          fVar131 = auVar74._4_4_;
          fVar133 = auVar74._8_4_;
          fVar135 = auVar74._12_4_;
          auVar151._0_4_ = -(uint)(fVar120 < 1.844e+18 && -1.844e+18 < fVar120);
          auVar151._4_4_ = -(uint)(fVar131 < 1.844e+18 && -1.844e+18 < fVar131);
          auVar151._8_4_ = -(uint)(fVar133 < 1.844e+18 && -1.844e+18 < fVar133);
          auVar151._12_4_ = -(uint)(fVar135 < 1.844e+18 && -1.844e+18 < fVar135);
          uVar19 = movmskps((int)pcVar8,auVar151);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          pcVar8 = pBVar7[uVar17].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar7[uVar17].super_RawBufferView.stride;
          pauVar1 = (undefined1 (*) [12])(pcVar8 + sVar9 * uVar18);
          auVar13 = *pauVar1;
          auVar184._0_4_ =
               -(uint)(*(float *)*pauVar1 < 1.844e+18 && -1.844e+18 < *(float *)*pauVar1);
          auVar184._4_4_ =
               -(uint)(*(float *)(*pauVar1 + 4) < 1.844e+18 && -1.844e+18 < *(float *)(*pauVar1 + 4)
                      );
          auVar184._8_4_ =
               -(uint)(*(float *)(*pauVar1 + 8) < 1.844e+18 && -1.844e+18 < *(float *)(*pauVar1 + 8)
                      );
          auVar184._12_4_ =
               -(uint)(*(float *)pauVar1[1] < 1.844e+18 && -1.844e+18 < *(float *)pauVar1[1]);
          uVar19 = movmskps((int)(sVar9 * uVar18),auVar184);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          lVar16 = sVar9 * (uVar14 + 1);
          pfVar2 = (float *)(pcVar8 + lVar16);
          fVar192 = *pfVar2;
          fVar194 = pfVar2[1];
          fVar159 = pfVar2[2];
          auVar216._0_4_ = -(uint)(fVar192 < 1.844e+18 && -1.844e+18 < fVar192);
          auVar216._4_4_ = -(uint)(fVar194 < 1.844e+18 && -1.844e+18 < fVar194);
          auVar216._8_4_ = -(uint)(fVar159 < 1.844e+18 && -1.844e+18 < fVar159);
          auVar216._12_4_ = -(uint)(pfVar2[3] < 1.844e+18 && -1.844e+18 < pfVar2[3]);
          uVar19 = movmskps((int)lVar16,auVar216);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          fVar214 = fVar214 * fVar122;
          fVar222 = fVar222 * fVar122;
          fVar118 = fVar118 * fVar122;
          fVar135 = fVar135 * fVar122;
          pfVar2 = (float *)(pcVar8 + sVar9 * uVar24);
          fVar160 = *pfVar2;
          fVar165 = pfVar2[1];
          fVar167 = pfVar2[2];
          pfVar2 = (float *)(pcVar8 + sVar9 * uVar23);
          fVar171 = *pfVar2;
          fVar172 = pfVar2[1];
          fVar183 = pfVar2[2];
          fVar223 = (fVar106 * 0.5 + fVar120 * 0.0 + fVar215 * 0.0) - fVar207 * 0.5;
          fVar228 = (fVar114 * 0.5 + fVar131 * 0.0 + fVar220 * 0.0) - fVar212 * 0.5;
          fVar229 = (fVar116 * 0.5 + fVar133 * 0.0 + fVar221 * 0.0) - fVar213 * 0.5;
          fVar231 = (fVar118 * 0.5 + fVar135 * 0.0 + fVar222 * 0.0) - fVar214 * 0.5;
          local_2b8._0_4_ = auVar13._0_4_;
          local_2b8._4_4_ = auVar13._4_4_;
          uStack_2b0._0_4_ = auVar13._8_4_;
          fVar170 = (fVar160 * 0.5 + fVar171 * 0.0 + fVar192 * 0.0) - (float)local_2b8._0_4_ * 0.5;
          fVar180 = (fVar165 * 0.5 + fVar172 * 0.0 + fVar194 * 0.0) - (float)local_2b8._4_4_ * 0.5;
          fVar181 = (fVar167 * 0.5 + fVar183 * 0.0 + fVar159 * 0.0) - (float)uStack_2b0 * 0.5;
          fVar28 = fVar106 * 0.0 + fVar120 * -0.0 + fVar215 + fVar207 * -0.0;
          fVar68 = fVar114 * 0.0 + fVar131 * -0.0 + fVar220 + fVar212 * -0.0;
          fVar70 = fVar116 * 0.0 + fVar133 * -0.0 + fVar221 + fVar213 * -0.0;
          fVar72 = fVar118 * 0.0 + fVar135 * -0.0 + fVar222 + fVar214 * -0.0;
          fVar182 = fVar160 * 0.0 + fVar171 * -0.0 + fVar192 + (float)local_2b8._0_4_ * -0.0;
          fVar191 = fVar165 * 0.0 + fVar172 * -0.0 + fVar194 + (float)local_2b8._4_4_ * -0.0;
          fVar193 = fVar167 * 0.0 + fVar183 * -0.0 + fVar159 + (float)uStack_2b0 * -0.0;
          fVar29 = fVar120 * -0.0 + fVar106 + fVar215 * 0.0 + fVar207 * -0.0;
          fVar69 = fVar131 * -0.0 + fVar114 + fVar220 * 0.0 + fVar212 * -0.0;
          fVar71 = fVar133 * -0.0 + fVar116 + fVar221 * 0.0 + fVar213 * -0.0;
          fVar73 = fVar135 * -0.0 + fVar118 + fVar222 * 0.0 + fVar214 * -0.0;
          fVar149 = fVar207 * 0.0 + ((fVar120 * 0.5 + fVar106 * 0.0) - fVar215 * 0.5);
          fVar156 = fVar212 * 0.0 + ((fVar131 * 0.5 + fVar114 * 0.0) - fVar220 * 0.5);
          fVar157 = fVar213 * 0.0 + ((fVar133 * 0.5 + fVar116 * 0.0) - fVar221 * 0.5);
          fVar158 = fVar214 * 0.0 + ((fVar135 * 0.5 + fVar118 * 0.0) - fVar222 * 0.5);
          fVar214 = fVar171 * -0.0 + fVar160 + fVar192 * 0.0 + (float)local_2b8._0_4_ * -0.0;
          fVar213 = fVar172 * -0.0 + fVar165 + fVar194 * 0.0 + (float)local_2b8._4_4_ * -0.0;
          fVar222 = fVar183 * -0.0 + fVar167 + fVar159 * 0.0 + (float)uStack_2b0 * -0.0;
          fVar220 = (float)local_2b8._0_4_ * 0.0 + ((fVar171 * 0.5 + fVar160 * 0.0) - fVar192 * 0.5)
          ;
          fVar215 = (float)local_2b8._4_4_ * 0.0 + ((fVar172 * 0.5 + fVar165 * 0.0) - fVar194 * 0.5)
          ;
          fVar106 = (float)uStack_2b0 * 0.0 + ((fVar183 * 0.5 + fVar167 * 0.0) - fVar159 * 0.5);
          fVar183 = fVar182 * fVar228 - fVar191 * fVar223;
          fVar192 = fVar191 * fVar229 - fVar193 * fVar228;
          fVar194 = fVar193 * fVar223 - fVar182 * fVar229;
          fVar207 = fVar228 * fVar170 - fVar180 * fVar223;
          fVar212 = fVar229 * fVar180 - fVar181 * fVar228;
          fVar221 = fVar223 * fVar181 - fVar170 * fVar229;
          fVar118 = fVar214 * fVar156 - fVar213 * fVar149;
          fVar116 = fVar213 * fVar157 - fVar222 * fVar156;
          fVar120 = fVar222 * fVar149 - fVar214 * fVar157;
          fVar213 = fVar156 * fVar220 - fVar215 * fVar149;
          fVar215 = fVar157 * fVar215 - fVar106 * fVar156;
          fVar220 = fVar149 * fVar106 - fVar220 * fVar157;
          fVar159 = fVar194 * fVar194 + fVar192 * fVar192 + fVar183 * fVar183;
          auVar173 = ZEXT416((uint)fVar159);
          auVar74 = rsqrtss(ZEXT416((uint)fVar159),auVar173);
          fVar214 = auVar74._0_4_;
          fVar171 = fVar214 * 1.5 - fVar214 * fVar214 * fVar159 * 0.5 * fVar214;
          fVar170 = fVar183 * fVar207 + fVar194 * fVar221 + fVar192 * fVar212;
          auVar74 = rcpss(auVar173,auVar173);
          fVar214 = (2.0 - fVar159 * auVar74._0_4_) * auVar74._0_4_;
          fVar133 = fVar120 * fVar120 + fVar116 * fVar116 + fVar118 * fVar118;
          auVar74 = ZEXT416((uint)fVar133);
          auVar173 = rsqrtss(ZEXT416((uint)fVar133),auVar74);
          fVar222 = auVar173._0_4_;
          fVar106 = fVar222 * 1.5 - fVar222 * fVar222 * fVar133 * 0.5 * fVar222;
          fVar172 = fVar118 * fVar213 + fVar120 * fVar220 + fVar116 * fVar215;
          auVar74 = rcpss(auVar74,auVar74);
          fVar222 = (2.0 - fVar133 * auVar74._0_4_) * auVar74._0_4_;
          fVar114 = fVar72 * fVar192 * fVar171;
          fVar135 = fVar72 * fVar194 * fVar171;
          fVar131 = fVar72 * fVar183 * fVar171;
          fVar160 = fVar28 - fVar114;
          fVar165 = fVar68 - fVar135;
          fVar167 = fVar70 - fVar131;
          fVar192 = fVar72 * fVar214 * (fVar159 * fVar212 - fVar170 * fVar192) * fVar171 +
                    fVar231 * fVar192 * fVar171;
          fVar194 = fVar72 * fVar214 * (fVar159 * fVar221 - fVar170 * fVar194) * fVar171 +
                    fVar231 * fVar194 * fVar171;
          fVar159 = fVar72 * fVar214 * (fVar159 * fVar207 - fVar170 * fVar183) * fVar171 +
                    fVar231 * fVar183 * fVar171;
          fVar214 = fVar73 * fVar116 * fVar106;
          fVar207 = fVar73 * fVar120 * fVar106;
          fVar212 = fVar73 * fVar118 * fVar106;
          fVar171 = fVar29 - fVar214;
          fVar183 = fVar69 - fVar207;
          fVar72 = fVar71 - fVar212;
          fVar221 = fVar73 * fVar222 * (fVar133 * fVar215 - fVar172 * fVar116) * fVar106 +
                    fVar158 * fVar116 * fVar106;
          fVar220 = fVar73 * fVar222 * (fVar133 * fVar220 - fVar172 * fVar120) * fVar106 +
                    fVar158 * fVar120 * fVar106;
          fVar118 = fVar73 * fVar222 * (fVar133 * fVar213 - fVar172 * fVar118) * fVar106 +
                    fVar158 * fVar118 * fVar106;
          fVar106 = (fVar223 - fVar192) * 0.33333334 + fVar160;
          fVar116 = (fVar228 - fVar194) * 0.33333334 + fVar165;
          fVar120 = (fVar229 - fVar159) * 0.33333334 + fVar167;
          fVar213 = fVar171 - (fVar149 - fVar221) * 0.33333334;
          fVar222 = fVar183 - (fVar156 - fVar220) * 0.33333334;
          fVar215 = fVar72 - (fVar157 - fVar118) * 0.33333334;
          lVar16 = 0;
          local_2a8 = _DAT_01feb9f0;
          _local_2b8 = _DAT_01feb9f0;
          local_298 = _DAT_01feba00;
          auVar124 = _DAT_01feba00;
          auVar74 = _DAT_01feb9f0;
          auVar226 = _DAT_01feba00;
          do {
            uVar205 = (uint)lVar16;
            lVar20 = lVar16 * 4;
            fVar133 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
            fVar172 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
            fVar73 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
            fVar158 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
            lVar20 = lVar16 * 4;
            fVar170 = *(float *)(bezier_basis0 + lVar20 + 0x660);
            fVar180 = *(float *)(bezier_basis0 + lVar20 + 0x664);
            fVar181 = *(float *)(bezier_basis0 + lVar20 + 0x668);
            fVar182 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
            lVar20 = lVar16 * 4;
            fVar191 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
            fVar193 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
            fVar231 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
            fVar206 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
            lVar20 = lVar16 * 4;
            fVar10 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
            fVar11 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
            fVar12 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
            fVar91 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
            auVar174._0_4_ =
                 fVar160 * fVar133 + fVar106 * fVar170 + fVar213 * fVar191 + fVar171 * fVar10;
            auVar174._4_4_ =
                 fVar160 * fVar172 + fVar106 * fVar180 + fVar213 * fVar193 + fVar171 * fVar11;
            auVar174._8_4_ =
                 fVar160 * fVar73 + fVar106 * fVar181 + fVar213 * fVar231 + fVar171 * fVar12;
            auVar174._12_4_ =
                 fVar160 * fVar158 + fVar106 * fVar182 + fVar213 * fVar206 + fVar171 * fVar91;
            auVar150._0_4_ =
                 fVar165 * fVar133 + fVar116 * fVar170 + fVar222 * fVar191 + fVar183 * fVar10;
            auVar150._4_4_ =
                 fVar165 * fVar172 + fVar116 * fVar180 + fVar222 * fVar193 + fVar183 * fVar11;
            auVar150._8_4_ =
                 fVar165 * fVar73 + fVar116 * fVar181 + fVar222 * fVar231 + fVar183 * fVar12;
            auVar150._12_4_ =
                 fVar165 * fVar158 + fVar116 * fVar182 + fVar222 * fVar206 + fVar183 * fVar91;
            local_128._0_4_ =
                 fVar133 * fVar167 + fVar170 * fVar120 + fVar191 * fVar215 + fVar10 * fVar72;
            local_128._4_4_ =
                 fVar172 * fVar167 + fVar180 * fVar120 + fVar193 * fVar215 + fVar11 * fVar72;
            fStack_120 = fVar73 * fVar167 + fVar181 * fVar120 + fVar231 * fVar215 + fVar12 * fVar72;
            fStack_11c = fVar158 * fVar167 + fVar182 * fVar120 + fVar206 * fVar215 + fVar91 * fVar72
            ;
            lVar20 = lVar16 * 4;
            fVar133 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
            fVar172 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
            fVar73 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
            fVar158 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
            lVar20 = lVar16 * 4;
            fVar170 = *(float *)(bezier_basis0 + lVar20 + 0x1870);
            fVar180 = *(float *)(bezier_basis0 + lVar20 + 0x1874);
            fVar181 = *(float *)(bezier_basis0 + lVar20 + 0x1878);
            fVar182 = *(float *)(bezier_basis0 + lVar20 + 0x187c);
            lVar20 = lVar16 * 4;
            fVar191 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
            fVar193 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
            fVar231 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
            fVar206 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
            lVar20 = lVar16 * 4;
            fVar10 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
            fVar11 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
            fVar12 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
            fVar91 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
            fVar107 = fVar160 * fVar133 + fVar106 * fVar170 + fVar213 * fVar191 + fVar171 * fVar10;
            fVar115 = fVar160 * fVar172 + fVar106 * fVar180 + fVar213 * fVar193 + fVar171 * fVar11;
            fVar117 = fVar160 * fVar73 + fVar106 * fVar181 + fVar213 * fVar231 + fVar171 * fVar12;
            fVar119 = fVar160 * fVar158 + fVar106 * fVar182 + fVar213 * fVar206 + fVar171 * fVar91;
            fVar161 = fVar165 * fVar133 + fVar116 * fVar170 + fVar222 * fVar191 + fVar183 * fVar10;
            fVar166 = fVar165 * fVar172 + fVar116 * fVar180 + fVar222 * fVar193 + fVar183 * fVar11;
            fVar168 = fVar165 * fVar73 + fVar116 * fVar181 + fVar222 * fVar231 + fVar183 * fVar12;
            fVar169 = fVar165 * fVar158 + fVar116 * fVar182 + fVar222 * fVar206 + fVar183 * fVar91;
            fVar133 = fVar133 * fVar167 + fVar170 * fVar120 + fVar191 * fVar215 + fVar10 * fVar72;
            fVar172 = fVar172 * fVar167 + fVar180 * fVar120 + fVar193 * fVar215 + fVar11 * fVar72;
            fVar73 = fVar73 * fVar167 + fVar181 * fVar120 + fVar231 * fVar215 + fVar12 * fVar72;
            fVar158 = fVar158 * fVar167 + fVar182 * fVar120 + fVar206 * fVar215 + fVar91 * fVar72;
            uVar137 = -(uint)(uVar205 == 0);
            uVar146 = -(uint)(uVar205 == 1);
            uVar147 = -(uint)(uVar205 == 2);
            uVar148 = -(uint)(uVar205 == 3);
            uVar121 = -(uint)(uVar205 == 7);
            uVar132 = -(uint)(uVar205 == 6);
            uVar134 = -(uint)(uVar205 == 5);
            uVar136 = -(uint)(uVar205 == 4);
            auVar208._0_4_ = (float)(~uVar121 & (uint)fVar107) * 0.055555556 + auVar174._0_4_;
            auVar208._4_4_ = (float)(~uVar132 & (uint)fVar115) * 0.055555556 + auVar174._4_4_;
            auVar208._8_4_ = (float)(~uVar134 & (uint)fVar117) * 0.055555556 + auVar174._8_4_;
            auVar208._12_4_ = (float)(~uVar136 & (uint)fVar119) * 0.055555556 + auVar174._12_4_;
            auVar108 = minps(_local_2b8,auVar174);
            auVar224 = maxps(auVar226,auVar174);
            auVar225._0_8_ =
                 CONCAT44(auVar174._4_4_ - (float)(~uVar146 & (uint)fVar115) * 0.055555556,
                          auVar174._0_4_ - (float)(~uVar137 & (uint)fVar107) * 0.055555556);
            auVar225._8_4_ = auVar174._8_4_ - (float)(~uVar147 & (uint)fVar117) * 0.055555556;
            auVar225._12_4_ = auVar174._12_4_ - (float)(~uVar148 & (uint)fVar119) * 0.055555556;
            auVar175._0_4_ = (float)(~uVar121 & (uint)fVar161) * 0.055555556 + auVar150._0_4_;
            auVar175._4_4_ = (float)(~uVar132 & (uint)fVar166) * 0.055555556 + auVar150._4_4_;
            auVar175._8_4_ = (float)(~uVar134 & (uint)fVar168) * 0.055555556 + auVar150._8_4_;
            auVar175._12_4_ = (float)(~uVar136 & (uint)fVar169) * 0.055555556 + auVar150._12_4_;
            auVar173 = minps(local_2a8,auVar150);
            auVar216 = maxps(local_298,auVar150);
            auVar201._0_8_ =
                 CONCAT44(auVar150._4_4_ - (float)(~uVar146 & (uint)fVar166) * 0.055555556,
                          auVar150._0_4_ - (float)(~uVar137 & (uint)fVar161) * 0.055555556);
            auVar201._8_4_ = auVar150._8_4_ - (float)(~uVar147 & (uint)fVar168) * 0.055555556;
            auVar201._12_4_ = auVar150._12_4_ - (float)(~uVar148 & (uint)fVar169) * 0.055555556;
            auVar30._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar30._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar30._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar30._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar123._0_4_ =
                 (float)(~uVar121 & (uint)fVar133) * 0.055555556 + (float)local_128._0_4_;
            auVar123._4_4_ =
                 (float)(~uVar132 & (uint)fVar172) * 0.055555556 + (float)local_128._4_4_;
            auVar123._8_4_ = (float)(~uVar134 & (uint)fVar73) * 0.055555556 + fStack_120;
            auVar123._12_4_ = (float)(~uVar136 & (uint)fVar158) * 0.055555556 + fStack_11c;
            auVar184 = minps(auVar74,_local_128);
            auVar151 = maxps(auVar124,_local_128);
            auVar92._0_8_ =
                 CONCAT44((float)local_128._4_4_ - (float)(~uVar146 & (uint)fVar172) * 0.055555556,
                          (float)local_128._0_4_ - (float)(~uVar137 & (uint)fVar133) * 0.055555556);
            auVar92._8_4_ = fStack_120 - (float)(~uVar147 & (uint)fVar73) * 0.055555556;
            auVar92._12_4_ = fStack_11c - (float)(~uVar148 & (uint)fVar158) * 0.055555556;
            auVar138._8_4_ = auVar225._8_4_;
            auVar138._0_8_ = auVar225._0_8_;
            auVar138._12_4_ = auVar225._12_4_;
            auVar139 = minps(auVar138,auVar208);
            auVar108 = minps(auVar108,auVar139);
            auVar140._8_4_ = auVar201._8_4_;
            auVar140._0_8_ = auVar201._0_8_;
            auVar140._12_4_ = auVar201._12_4_;
            auVar139 = minps(auVar140,auVar175);
            auVar173 = minps(auVar173,auVar139);
            auVar141._8_4_ = auVar92._8_4_;
            auVar141._0_8_ = auVar92._0_8_;
            auVar141._12_4_ = auVar92._12_4_;
            auVar139 = minps(auVar141,auVar123);
            auVar139 = minps(auVar184,auVar139);
            _local_2b8 = _local_2b8 & auVar30 | ~auVar30 & auVar108;
            auVar195._0_4_ = local_2a8._0_4_ & auVar30._0_4_;
            auVar195._4_4_ = local_2a8._4_4_ & auVar30._4_4_;
            auVar195._8_4_ = local_2a8._8_4_ & auVar30._8_4_;
            auVar195._12_4_ = local_2a8._12_4_ & auVar30._12_4_;
            local_2a8 = auVar195 | ~auVar30 & auVar173;
            auVar31._0_4_ = ~auVar30._0_4_ & auVar139._0_4_;
            auVar31._4_4_ = ~auVar30._4_4_ & auVar139._4_4_;
            auVar31._8_4_ = ~auVar30._8_4_ & auVar139._8_4_;
            auVar31._12_4_ = ~auVar30._12_4_ & auVar139._12_4_;
            auVar196._0_4_ = auVar74._0_4_ & auVar30._0_4_;
            auVar196._4_4_ = auVar74._4_4_ & auVar30._4_4_;
            auVar196._8_4_ = auVar74._8_4_ & auVar30._8_4_;
            auVar196._12_4_ = auVar74._12_4_ & auVar30._12_4_;
            auVar74 = auVar196 | auVar31;
            auVar173 = maxps(auVar225,auVar208);
            auVar173 = maxps(auVar224,auVar173);
            local_228._0_4_ = auVar226._0_4_;
            local_228._4_4_ = auVar226._4_4_;
            fStack_220 = auVar226._8_4_;
            fStack_21c = auVar226._12_4_;
            auVar108 = maxps(auVar201,auVar175);
            auVar139 = maxps(auVar216,auVar108);
            auVar108 = maxps(auVar92,auVar123);
            auVar108 = maxps(auVar151,auVar108);
            auVar224._0_4_ = ~auVar30._0_4_ & auVar173._0_4_;
            auVar224._4_4_ = ~auVar30._4_4_ & auVar173._4_4_;
            auVar224._8_4_ = ~auVar30._8_4_ & auVar173._8_4_;
            auVar224._12_4_ = ~auVar30._12_4_ & auVar173._12_4_;
            auVar226._0_4_ = local_228._0_4_ & auVar30._0_4_;
            auVar226._4_4_ = local_228._4_4_ & auVar30._4_4_;
            auVar226._8_4_ = (uint)fStack_220 & auVar30._8_4_;
            auVar226._12_4_ = (uint)fStack_21c & auVar30._12_4_;
            auVar226 = auVar226 | auVar224;
            uVar205 = local_298._0_4_ & auVar30._0_4_ | ~auVar30._0_4_ & auVar139._0_4_;
            uVar121 = local_298._4_4_ & auVar30._4_4_ | ~auVar30._4_4_ & auVar139._4_4_;
            uVar132 = local_298._8_4_ & auVar30._8_4_ | ~auVar30._8_4_ & auVar139._8_4_;
            local_298._12_4_ = local_298._12_4_ & auVar30._12_4_ | ~auVar30._12_4_ & auVar139._12_4_
            ;
            local_298._4_4_ = uVar121;
            local_298._0_4_ = uVar205;
            local_298._8_4_ = uVar132;
            local_278._0_4_ = auVar124._0_4_;
            local_278._4_4_ = auVar124._4_4_;
            fStack_270 = auVar124._8_4_;
            fStack_26c = auVar124._12_4_;
            auVar32._0_4_ = local_278._0_4_ & auVar30._0_4_;
            auVar32._4_4_ = local_278._4_4_ & auVar30._4_4_;
            auVar32._8_4_ = (uint)fStack_270 & auVar30._8_4_;
            auVar32._12_4_ = (uint)fStack_26c & auVar30._12_4_;
            auVar124._4_4_ = ~auVar30._4_4_ & auVar108._4_4_;
            auVar124._0_4_ = ~auVar30._0_4_ & auVar108._0_4_;
            auVar124._8_4_ = ~auVar30._8_4_ & auVar108._8_4_;
            auVar124._12_4_ = ~auVar30._12_4_ & auVar108._12_4_;
            auVar124 = auVar124 | auVar32;
            lVar16 = lVar16 + 4;
          } while (lVar16 == 4);
          fVar28 = fVar28 + fVar114;
          fVar68 = fVar68 + fVar135;
          fVar70 = fVar70 + fVar131;
          fVar29 = fVar29 + fVar214;
          fVar69 = fVar69 + fVar207;
          fVar71 = fVar71 + fVar212;
          fVar213 = (fVar192 + fVar223) * 0.33333334 + fVar28;
          fVar222 = (fVar194 + fVar228) * 0.33333334 + fVar68;
          fVar215 = (fVar159 + fVar229) * 0.33333334 + fVar70;
          fVar214 = fVar29 - (fVar221 + fVar149) * 0.33333334;
          fVar207 = fVar69 - (fVar220 + fVar156) * 0.33333334;
          fVar212 = fVar71 - (fVar118 + fVar157) * 0.33333334;
          auVar33._4_4_ = local_2b8._0_4_;
          auVar33._0_4_ = local_2b8._4_4_;
          auVar33._8_4_ = local_2b8._12_4_;
          auVar33._12_4_ = local_2b8._8_4_;
          auVar173 = minps(auVar33,_local_2b8);
          auVar75._0_8_ = auVar173._8_8_;
          auVar75._8_4_ = auVar173._0_4_;
          auVar75._12_4_ = auVar173._4_4_;
          auVar108 = minps(auVar75,auVar173);
          auVar34._4_4_ = local_2a8._0_4_;
          auVar34._0_4_ = local_2a8._4_4_;
          auVar34._8_4_ = local_2a8._12_4_;
          auVar34._12_4_ = local_2a8._8_4_;
          auVar173 = minps(auVar34,local_2a8);
          auVar93._0_8_ = auVar173._8_8_;
          auVar93._8_4_ = auVar173._0_4_;
          auVar93._12_4_ = auVar173._4_4_;
          auVar173 = minps(auVar93,auVar173);
          auVar35._4_4_ = auVar74._0_4_;
          auVar35._0_4_ = auVar74._4_4_;
          auVar35._8_4_ = auVar74._12_4_;
          auVar35._12_4_ = auVar74._8_4_;
          auVar74 = minps(auVar35,auVar74);
          auVar36._0_8_ = auVar74._8_8_;
          auVar36._8_4_ = auVar74._0_4_;
          auVar36._12_4_ = auVar74._4_4_;
          auVar109._4_4_ = auVar173._0_4_;
          auVar109._0_4_ = auVar108._0_4_;
          auVar37._4_4_ = auVar226._0_4_;
          auVar37._0_4_ = auVar226._4_4_;
          auVar37._8_4_ = auVar226._12_4_;
          auVar37._12_4_ = auVar226._8_4_;
          auVar173 = maxps(auVar37,auVar226);
          auVar76._0_8_ = auVar173._8_8_;
          auVar76._8_4_ = auVar173._0_4_;
          auVar76._12_4_ = auVar173._4_4_;
          auVar108 = maxps(auVar76,auVar173);
          auVar38._4_4_ = uVar205;
          auVar38._0_4_ = uVar121;
          auVar38._8_4_ = local_298._12_4_;
          auVar38._12_4_ = uVar132;
          auVar173 = maxps(auVar38,local_298);
          auVar94._0_8_ = auVar173._8_8_;
          auVar94._8_4_ = auVar173._0_4_;
          auVar94._12_4_ = auVar173._4_4_;
          auVar139 = maxps(auVar94,auVar173);
          auVar39._4_4_ = auVar124._0_4_;
          auVar39._0_4_ = auVar124._4_4_;
          auVar39._8_4_ = auVar124._12_4_;
          auVar39._12_4_ = auVar124._8_4_;
          auVar173 = maxps(auVar39,auVar124);
          auVar40._0_8_ = auVar173._8_8_;
          auVar40._8_4_ = auVar173._0_4_;
          auVar40._12_4_ = auVar173._4_4_;
          auVar125._4_4_ = auVar139._0_4_;
          auVar125._0_4_ = auVar108._0_4_;
          lVar16 = 0;
          local_288._8_8_ = 0x7f8000007f800000;
          local_288._0_8_ = 0x7f8000007f800000;
          local_258._8_8_ = 0x7f8000007f800000;
          local_258._0_8_ = 0x7f8000007f800000;
          uStack_2b0 = 0x7f8000007f800000;
          local_2b8 = (undefined1  [8])0x7f8000007f800000;
          local_298 = _DAT_01feba00;
          local_2a8 = _DAT_01feba00;
          auVar217 = _DAT_01feba00;
          do {
            uVar205 = (uint)lVar16;
            lVar20 = lVar16 * 4;
            fVar220 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
            fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
            fVar118 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
            fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
            lVar20 = lVar16 * 4;
            fVar114 = *(float *)(bezier_basis0 + lVar20 + 0x660);
            fVar116 = *(float *)(bezier_basis0 + lVar20 + 0x664);
            fVar135 = *(float *)(bezier_basis0 + lVar20 + 0x668);
            fVar120 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
            lVar20 = lVar16 * 4;
            fVar131 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
            fVar133 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
            fVar192 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
            fVar194 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
            lVar20 = lVar16 * 4;
            fVar159 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
            fVar160 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
            fVar165 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
            fVar167 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
            auVar142._0_4_ =
                 fVar28 * fVar220 + fVar213 * fVar114 + fVar214 * fVar131 + fVar29 * fVar159;
            auVar142._4_4_ =
                 fVar28 * fVar221 + fVar213 * fVar116 + fVar214 * fVar133 + fVar29 * fVar160;
            auVar142._8_4_ =
                 fVar28 * fVar118 + fVar213 * fVar135 + fVar214 * fVar192 + fVar29 * fVar165;
            auVar142._12_4_ =
                 fVar28 * fVar106 + fVar213 * fVar120 + fVar214 * fVar194 + fVar29 * fVar167;
            auVar197._0_4_ =
                 fVar68 * fVar220 + fVar222 * fVar114 + fVar207 * fVar131 + fVar69 * fVar159;
            auVar197._4_4_ =
                 fVar68 * fVar221 + fVar222 * fVar116 + fVar207 * fVar133 + fVar69 * fVar160;
            auVar197._8_4_ =
                 fVar68 * fVar118 + fVar222 * fVar135 + fVar207 * fVar192 + fVar69 * fVar165;
            auVar197._12_4_ =
                 fVar68 * fVar106 + fVar222 * fVar120 + fVar207 * fVar194 + fVar69 * fVar167;
            local_228._0_4_ =
                 fVar220 * fVar70 + fVar114 * fVar215 + fVar131 * fVar212 + fVar159 * fVar71;
            local_228._4_4_ =
                 fVar221 * fVar70 + fVar116 * fVar215 + fVar133 * fVar212 + fVar160 * fVar71;
            fStack_220 = fVar118 * fVar70 + fVar135 * fVar215 + fVar192 * fVar212 + fVar165 * fVar71
            ;
            fStack_21c = fVar106 * fVar70 + fVar120 * fVar215 + fVar194 * fVar212 + fVar167 * fVar71
            ;
            lVar20 = lVar16 * 4;
            fVar220 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
            fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
            fVar118 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
            fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
            lVar20 = lVar16 * 4;
            fVar114 = *(float *)(bezier_basis0 + lVar20 + 0x1870);
            fVar116 = *(float *)(bezier_basis0 + lVar20 + 0x1874);
            fVar135 = *(float *)(bezier_basis0 + lVar20 + 0x1878);
            fVar120 = *(float *)(bezier_basis0 + lVar20 + 0x187c);
            lVar20 = lVar16 * 4;
            fVar131 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
            fVar133 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
            fVar192 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
            fVar194 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
            lVar20 = lVar16 * 4;
            fVar159 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
            fVar160 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
            fVar165 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
            fVar167 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
            fVar73 = fVar28 * fVar220 + fVar213 * fVar114 + fVar214 * fVar131 + fVar29 * fVar159;
            fVar149 = fVar28 * fVar221 + fVar213 * fVar116 + fVar214 * fVar133 + fVar29 * fVar160;
            fVar156 = fVar28 * fVar118 + fVar213 * fVar135 + fVar214 * fVar192 + fVar29 * fVar165;
            fVar157 = fVar28 * fVar106 + fVar213 * fVar120 + fVar214 * fVar194 + fVar29 * fVar167;
            fVar171 = fVar68 * fVar220 + fVar222 * fVar114 + fVar207 * fVar131 + fVar69 * fVar159;
            fVar172 = fVar68 * fVar221 + fVar222 * fVar116 + fVar207 * fVar133 + fVar69 * fVar160;
            fVar183 = fVar68 * fVar118 + fVar222 * fVar135 + fVar207 * fVar192 + fVar69 * fVar165;
            fVar72 = fVar68 * fVar106 + fVar222 * fVar120 + fVar207 * fVar194 + fVar69 * fVar167;
            fVar220 = fVar220 * fVar70 + fVar114 * fVar215 + fVar131 * fVar212 + fVar159 * fVar71;
            fVar221 = fVar221 * fVar70 + fVar116 * fVar215 + fVar133 * fVar212 + fVar160 * fVar71;
            fVar118 = fVar118 * fVar70 + fVar135 * fVar215 + fVar192 * fVar212 + fVar165 * fVar71;
            fVar106 = fVar106 * fVar70 + fVar120 * fVar215 + fVar194 * fVar212 + fVar167 * fVar71;
            uVar121 = -(uint)(uVar205 == 0);
            uVar132 = -(uint)(uVar205 == 1);
            uVar134 = -(uint)(uVar205 == 2);
            uVar136 = -(uint)(uVar205 == 3);
            uVar137 = -(uint)(uVar205 == 7);
            uVar146 = -(uint)(uVar205 == 6);
            uVar147 = -(uint)(uVar205 == 5);
            uVar148 = -(uint)(uVar205 == 4);
            local_118._4_4_ = (float)(~uVar146 & (uint)fVar149) * 0.055555556 + auVar142._4_4_;
            local_118._0_4_ = (float)(~uVar137 & (uint)fVar73) * 0.055555556 + auVar142._0_4_;
            fStack_110 = (float)(~uVar147 & (uint)fVar156) * 0.055555556 + auVar142._8_4_;
            fStack_10c = (float)(~uVar148 & (uint)fVar157) * 0.055555556 + auVar142._12_4_;
            auVar226 = minps(_local_2b8,auVar142);
            auVar139 = maxps(local_2a8,auVar142);
            auVar143._0_8_ =
                 CONCAT44(auVar142._4_4_ - (float)(~uVar132 & (uint)fVar149) * 0.055555556,
                          auVar142._0_4_ - (float)(~uVar121 & (uint)fVar73) * 0.055555556);
            auVar143._8_4_ = auVar142._8_4_ - (float)(~uVar134 & (uint)fVar156) * 0.055555556;
            auVar143._12_4_ = auVar142._12_4_ - (float)(~uVar136 & (uint)fVar157) * 0.055555556;
            auVar176._0_4_ = (float)(~uVar137 & (uint)fVar171) * 0.055555556 + auVar197._0_4_;
            auVar176._4_4_ = (float)(~uVar146 & (uint)fVar172) * 0.055555556 + auVar197._4_4_;
            auVar176._8_4_ = (float)(~uVar147 & (uint)fVar183) * 0.055555556 + auVar197._8_4_;
            auVar176._12_4_ = (float)(~uVar148 & (uint)fVar72) * 0.055555556 + auVar197._12_4_;
            auVar184 = minps(local_258,auVar197);
            auVar124 = maxps(local_298,auVar197);
            auVar198._0_8_ =
                 CONCAT44(auVar197._4_4_ - (float)(~uVar132 & (uint)fVar172) * 0.055555556,
                          auVar197._0_4_ - (float)(~uVar121 & (uint)fVar171) * 0.055555556);
            auVar198._8_4_ = auVar197._8_4_ - (float)(~uVar134 & (uint)fVar183) * 0.055555556;
            auVar198._12_4_ = auVar197._12_4_ - (float)(~uVar136 & (uint)fVar72) * 0.055555556;
            auVar41._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar41._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar41._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar41._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar205 ^ 0x80000000));
            auVar202._0_4_ =
                 (float)(~uVar137 & (uint)fVar220) * 0.055555556 + (float)local_228._0_4_;
            auVar202._4_4_ =
                 (float)(~uVar146 & (uint)fVar221) * 0.055555556 + (float)local_228._4_4_;
            auVar202._8_4_ = (float)(~uVar147 & (uint)fVar118) * 0.055555556 + fStack_220;
            auVar202._12_4_ = (float)(~uVar148 & (uint)fVar106) * 0.055555556 + fStack_21c;
            auVar108 = minps(local_288,_local_228);
            auVar151 = maxps(auVar217,_local_228);
            auVar227._0_8_ =
                 CONCAT44((float)local_228._4_4_ - (float)(~uVar132 & (uint)fVar221) * 0.055555556,
                          (float)local_228._0_4_ - (float)(~uVar121 & (uint)fVar220) * 0.055555556);
            auVar227._8_4_ = fStack_220 - (float)(~uVar134 & (uint)fVar118) * 0.055555556;
            auVar227._12_4_ = fStack_21c - (float)(~uVar136 & (uint)fVar106) * 0.055555556;
            auVar185._8_4_ = auVar143._8_4_;
            auVar185._0_8_ = auVar143._0_8_;
            auVar185._12_4_ = auVar143._12_4_;
            auVar216 = minps(auVar185,_local_118);
            auVar226 = minps(auVar226,auVar216);
            auVar186._8_4_ = auVar198._8_4_;
            auVar186._0_8_ = auVar198._0_8_;
            auVar186._12_4_ = auVar198._12_4_;
            auVar216 = minps(auVar186,auVar176);
            auVar184 = minps(auVar184,auVar216);
            auVar187._8_4_ = auVar227._8_4_;
            auVar187._0_8_ = auVar227._0_8_;
            auVar187._12_4_ = auVar227._12_4_;
            auVar216 = minps(auVar187,auVar202);
            auVar108 = minps(auVar108,auVar216);
            _local_2b8 = _local_2b8 & auVar41 | ~auVar41 & auVar226;
            auVar162._0_4_ = local_258._0_4_ & auVar41._0_4_;
            auVar162._4_4_ = local_258._4_4_ & auVar41._4_4_;
            auVar162._8_4_ = local_258._8_4_ & auVar41._8_4_;
            auVar162._12_4_ = local_258._12_4_ & auVar41._12_4_;
            local_258 = auVar162 | ~auVar41 & auVar184;
            uVar205 = local_288._0_4_ & auVar41._0_4_ | ~auVar41._0_4_ & auVar108._0_4_;
            uVar121 = local_288._4_4_ & auVar41._4_4_ | ~auVar41._4_4_ & auVar108._4_4_;
            uVar132 = local_288._8_4_ & auVar41._8_4_ | ~auVar41._8_4_ & auVar108._8_4_;
            local_288._12_4_ = local_288._12_4_ & auVar41._12_4_ | ~auVar41._12_4_ & auVar108._12_4_
            ;
            local_288._4_4_ = uVar121;
            local_288._0_4_ = uVar205;
            local_288._8_4_ = uVar132;
            auVar108 = maxps(auVar143,_local_118);
            auVar108 = maxps(auVar139,auVar108);
            auVar139 = maxps(auVar198,auVar176);
            auVar184 = maxps(auVar124,auVar139);
            auVar139 = maxps(auVar227,auVar202);
            auVar139 = maxps(auVar151,auVar139);
            uVar134 = local_2a8._0_4_ & auVar41._0_4_ | ~auVar41._0_4_ & auVar108._0_4_;
            uVar136 = local_2a8._4_4_ & auVar41._4_4_ | ~auVar41._4_4_ & auVar108._4_4_;
            uVar137 = local_2a8._8_4_ & auVar41._8_4_ | ~auVar41._8_4_ & auVar108._8_4_;
            local_2a8._12_4_ = local_2a8._12_4_ & auVar41._12_4_ | ~auVar41._12_4_ & auVar108._12_4_
            ;
            local_2a8._4_4_ = uVar136;
            local_2a8._0_4_ = uVar134;
            local_2a8._8_4_ = uVar137;
            uVar146 = local_298._0_4_ & auVar41._0_4_ | ~auVar41._0_4_ & auVar184._0_4_;
            uVar147 = local_298._4_4_ & auVar41._4_4_ | ~auVar41._4_4_ & auVar184._4_4_;
            uVar148 = local_298._8_4_ & auVar41._8_4_ | ~auVar41._8_4_ & auVar184._8_4_;
            local_298._12_4_ = local_298._12_4_ & auVar41._12_4_ | ~auVar41._12_4_ & auVar184._12_4_
            ;
            local_298._4_4_ = uVar147;
            local_298._0_4_ = uVar146;
            local_298._8_4_ = uVar148;
            local_278._0_4_ = auVar217._0_4_;
            local_278._4_4_ = auVar217._4_4_;
            fStack_270 = auVar217._8_4_;
            fStack_26c = auVar217._12_4_;
            auVar77._0_4_ = local_278._0_4_ & auVar41._0_4_;
            auVar77._4_4_ = local_278._4_4_ & auVar41._4_4_;
            auVar77._8_4_ = (uint)fStack_270 & auVar41._8_4_;
            auVar77._12_4_ = (uint)fStack_26c & auVar41._12_4_;
            auVar217._4_4_ = ~auVar41._4_4_ & auVar139._4_4_;
            auVar217._0_4_ = ~auVar41._0_4_ & auVar139._0_4_;
            auVar217._8_4_ = ~auVar41._8_4_ & auVar139._8_4_;
            auVar217._12_4_ = ~auVar41._12_4_ & auVar139._12_4_;
            auVar217 = auVar217 | auVar77;
            lVar16 = lVar16 + 4;
          } while (lVar16 == 4);
          auVar74 = minps(auVar36,auVar74);
          auVar109._8_4_ = auVar74._0_4_;
          auVar109._12_4_ = 0;
          auVar74 = maxps(auVar40,auVar173);
          auVar125._8_4_ = auVar74._0_4_;
          auVar125._12_4_ = 0;
          auVar42._4_4_ = local_2b8._0_4_;
          auVar42._0_4_ = local_2b8._4_4_;
          auVar42._8_4_ = local_2b8._12_4_;
          auVar42._12_4_ = local_2b8._8_4_;
          auVar74 = minps(auVar42,_local_2b8);
          auVar78._0_8_ = auVar74._8_8_;
          auVar78._8_4_ = auVar74._0_4_;
          auVar78._12_4_ = auVar74._4_4_;
          auVar173 = minps(auVar78,auVar74);
          auVar43._4_4_ = local_258._0_4_;
          auVar43._0_4_ = local_258._4_4_;
          auVar43._8_4_ = local_258._12_4_;
          auVar43._12_4_ = local_258._8_4_;
          auVar74 = minps(auVar43,local_258);
          auVar95._0_8_ = auVar74._8_8_;
          auVar95._8_4_ = auVar74._0_4_;
          auVar95._12_4_ = auVar74._4_4_;
          auVar108 = minps(auVar95,auVar74);
          auVar44._4_4_ = uVar205;
          auVar44._0_4_ = uVar121;
          auVar44._8_4_ = local_288._12_4_;
          auVar44._12_4_ = uVar132;
          auVar74 = minps(auVar44,local_288);
          auVar79._0_8_ = auVar74._8_8_;
          auVar79._8_4_ = auVar74._0_4_;
          auVar79._12_4_ = auVar74._4_4_;
          auVar74 = minps(auVar79,auVar74);
          auVar96._4_4_ = auVar108._0_4_;
          auVar96._0_4_ = auVar173._0_4_;
          auVar96._8_4_ = auVar74._0_4_;
          auVar96._12_4_ = 0;
          auVar139 = minps(auVar109,auVar96);
          auVar45._4_4_ = uVar134;
          auVar45._0_4_ = uVar136;
          auVar45._8_4_ = local_2a8._12_4_;
          auVar45._12_4_ = uVar137;
          auVar74 = maxps(auVar45,local_2a8);
          auVar80._0_8_ = auVar74._8_8_;
          auVar80._8_4_ = auVar74._0_4_;
          auVar80._12_4_ = auVar74._4_4_;
          auVar173 = maxps(auVar80,auVar74);
          auVar46._4_4_ = uVar146;
          auVar46._0_4_ = uVar147;
          auVar46._8_4_ = local_298._12_4_;
          auVar46._12_4_ = uVar148;
          auVar74 = maxps(auVar46,local_298);
          auVar97._0_8_ = auVar74._8_8_;
          auVar97._8_4_ = auVar74._0_4_;
          auVar97._12_4_ = auVar74._4_4_;
          auVar108 = maxps(auVar97,auVar74);
          auVar47._4_4_ = auVar217._0_4_;
          auVar47._0_4_ = auVar217._4_4_;
          auVar47._8_4_ = auVar217._12_4_;
          auVar47._12_4_ = auVar217._8_4_;
          auVar74 = maxps(auVar47,auVar217);
          auVar81._0_8_ = auVar74._8_8_;
          auVar81._8_4_ = auVar74._0_4_;
          auVar81._12_4_ = auVar74._4_4_;
          auVar74 = maxps(auVar81,auVar74);
          auVar98._4_4_ = auVar108._0_4_;
          auVar98._0_4_ = auVar173._0_4_;
          auVar98._8_4_ = auVar74._0_4_;
          auVar98._12_4_ = 0;
          auVar74 = maxps(auVar125,auVar98);
          auVar126._0_4_ = -(uint)(auVar74._0_4_ < 1.844e+18 && -1.844e+18 < auVar139._0_4_);
          auVar126._4_4_ = -(uint)(auVar74._4_4_ < 1.844e+18 && -1.844e+18 < auVar139._4_4_);
          auVar126._8_4_ = -(uint)(auVar74._8_4_ < 1.844e+18 && -1.844e+18 < auVar139._8_4_);
          auVar126._12_4_ = -(uint)(auVar74._12_4_ < 1.844e+18 && -1.844e+18 < auVar139._12_4_);
          uVar19 = movmskps((int)pcVar8,auVar126);
          if ((~(byte)uVar19 & 7) != 0) goto LAB_00ab3163;
          bVar26 = uVar15 <= uVar17;
          bVar27 = uVar17 != uVar15;
          uVar17 = uVar17 + 1;
        } while (bVar27);
        pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar6->super_RawBufferView).stride;
        pfVar2 = (float *)(pcVar8 + sVar9 * uVar18);
        fVar214 = *pfVar2;
        fVar207 = pfVar2[1];
        fVar212 = pfVar2[2];
        pfVar3 = (float *)(pcVar8 + sVar9 * (uVar14 + 1));
        fVar213 = *pfVar3;
        fVar222 = pfVar3[1];
        fVar215 = pfVar3[2];
        pfVar4 = (float *)(pcVar8 + sVar9 * (uVar14 + 2));
        fVar220 = *pfVar4;
        fVar221 = pfVar4[1];
        fVar118 = pfVar4[2];
        pfVar5 = (float *)(pcVar8 + sVar9 * uVar23);
        fVar106 = *pfVar5;
        fVar114 = pfVar5[1];
        fVar116 = pfVar5[2];
        fVar122 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .maxRadiusScale;
        fVar72 = pfVar2[3] * fVar122;
        fVar73 = pfVar3[3] * fVar122;
        fVar149 = pfVar4[3] * fVar122;
        fVar122 = pfVar5[3] * fVar122;
        pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar7->super_RawBufferView).stride;
        pfVar2 = (float *)(pcVar8 + uVar18 * sVar9);
        fVar135 = *pfVar2;
        fVar120 = pfVar2[1];
        fVar131 = pfVar2[2];
        pfVar2 = (float *)(pcVar8 + (uVar14 + 1) * sVar9);
        fVar133 = *pfVar2;
        fVar192 = pfVar2[1];
        fVar194 = pfVar2[2];
        pfVar2 = (float *)(pcVar8 + (uVar14 + 2) * sVar9);
        fVar159 = *pfVar2;
        fVar160 = pfVar2[1];
        fVar165 = pfVar2[2];
        pfVar2 = (float *)(pcVar8 + sVar9 * uVar23);
        fVar167 = *pfVar2;
        fVar171 = pfVar2[1];
        fVar172 = pfVar2[2];
        fVar69 = fVar220 * 0.0 + fVar106 * -0.0 + fVar213 + fVar214 * -0.0;
        fVar70 = fVar221 * 0.0 + fVar114 * -0.0 + fVar222 + fVar207 * -0.0;
        fVar71 = fVar118 * 0.0 + fVar116 * -0.0 + fVar215 + fVar212 * -0.0;
        fVar206 = fVar149 * 0.0 + fVar122 * -0.0 + fVar73 + fVar72 * -0.0;
        fVar183 = (fVar220 * 0.5 + fVar106 * 0.0 + fVar213 * 0.0) - fVar214 * 0.5;
        fVar28 = (fVar221 * 0.5 + fVar114 * 0.0 + fVar222 * 0.0) - fVar207 * 0.5;
        fVar29 = (fVar118 * 0.5 + fVar116 * 0.0 + fVar215 * 0.0) - fVar212 * 0.5;
        fVar68 = (fVar149 * 0.5 + fVar122 * 0.0 + fVar73 * 0.0) - fVar72 * 0.5;
        fVar180 = (fVar159 * 0.5 + fVar167 * 0.0 + fVar133 * 0.0) - fVar135 * 0.5;
        fVar181 = (fVar160 * 0.5 + fVar171 * 0.0 + fVar192 * 0.0) - fVar120 * 0.5;
        fVar182 = (fVar165 * 0.5 + fVar172 * 0.0 + fVar194 * 0.0) - fVar131 * 0.5;
        fVar228 = fVar159 * 0.0 + fVar167 * -0.0 + fVar133 + fVar135 * -0.0;
        fVar229 = fVar160 * 0.0 + fVar171 * -0.0 + fVar192 + fVar120 * -0.0;
        fVar231 = fVar165 * 0.0 + fVar172 * -0.0 + fVar194 + fVar131 * -0.0;
        fVar156 = fVar106 * -0.0 + fVar220 + fVar213 * 0.0 + fVar214 * -0.0;
        fVar157 = fVar114 * -0.0 + fVar221 + fVar222 * 0.0 + fVar207 * -0.0;
        fVar158 = fVar116 * -0.0 + fVar118 + fVar215 * 0.0 + fVar212 * -0.0;
        fVar170 = fVar122 * -0.0 + fVar149 + fVar73 * 0.0 + fVar72 * -0.0;
        fVar191 = fVar214 * 0.0 + ((fVar106 * 0.5 + fVar220 * 0.0) - fVar213 * 0.5);
        fVar193 = fVar207 * 0.0 + ((fVar114 * 0.5 + fVar221 * 0.0) - fVar222 * 0.5);
        fVar223 = fVar212 * 0.0 + ((fVar116 * 0.5 + fVar118 * 0.0) - fVar215 * 0.5);
        fVar73 = fVar72 * 0.0 + ((fVar122 * 0.5 + fVar149 * 0.0) - fVar73 * 0.5);
        fVar212 = fVar167 * -0.0 + fVar159 + fVar133 * 0.0 + fVar135 * -0.0;
        fVar213 = fVar171 * -0.0 + fVar160 + fVar192 * 0.0 + fVar120 * -0.0;
        fVar222 = fVar172 * -0.0 + fVar165 + fVar194 * 0.0 + fVar131 * -0.0;
        fVar122 = fVar135 * 0.0 + ((fVar167 * 0.5 + fVar159 * 0.0) - fVar133 * 0.5);
        fVar214 = fVar120 * 0.0 + ((fVar171 * 0.5 + fVar160 * 0.0) - fVar192 * 0.5);
        fVar207 = fVar131 * 0.0 + ((fVar172 * 0.5 + fVar165 * 0.0) - fVar194 * 0.5);
        fVar194 = fVar28 * fVar228 - fVar229 * fVar183;
        fVar171 = fVar29 * fVar229 - fVar231 * fVar28;
        fVar172 = fVar183 * fVar231 - fVar228 * fVar29;
        fVar120 = fVar28 * fVar180 - fVar181 * fVar183;
        fVar131 = fVar29 * fVar181 - fVar182 * fVar28;
        fVar133 = fVar183 * fVar182 - fVar180 * fVar29;
        fVar220 = fVar193 * fVar212 - fVar213 * fVar191;
        fVar106 = fVar223 * fVar213 - fVar222 * fVar193;
        fVar116 = fVar191 * fVar222 - fVar212 * fVar223;
        fVar212 = fVar193 * fVar122 - fVar214 * fVar191;
        fVar222 = fVar223 * fVar214 - fVar207 * fVar193;
        fVar215 = fVar191 * fVar207 - fVar122 * fVar223;
        fVar214 = fVar172 * fVar172 + fVar171 * fVar171 + fVar194 * fVar194;
        auVar173 = ZEXT416((uint)fVar214);
        auVar74 = rsqrtss(ZEXT416((uint)fVar214),auVar173);
        fVar122 = auVar74._0_4_;
        fVar207 = fVar122 * 1.5 - fVar122 * fVar122 * fVar214 * 0.5 * fVar122;
        fVar72 = fVar194 * fVar120 + fVar172 * fVar133 + fVar171 * fVar131;
        auVar74 = rcpss(auVar173,auVar173);
        fVar122 = (2.0 - fVar214 * auVar74._0_4_) * auVar74._0_4_;
        fVar192 = fVar116 * fVar116 + fVar106 * fVar106 + fVar220 * fVar220;
        auVar74 = ZEXT416((uint)fVar192);
        auVar173 = rsqrtss(ZEXT416((uint)fVar192),auVar74);
        fVar213 = auVar173._0_4_;
        fVar221 = fVar213 * 1.5 - fVar213 * fVar213 * fVar192 * 0.5 * fVar213;
        fVar167 = fVar220 * fVar212 + fVar116 * fVar215 + fVar106 * fVar222;
        auVar74 = rcpss(auVar74,auVar74);
        fVar213 = (2.0 - fVar192 * auVar74._0_4_) * auVar74._0_4_;
        fVar118 = fVar206 * fVar171 * fVar207;
        fVar114 = fVar206 * fVar172 * fVar207;
        fVar135 = fVar206 * fVar194 * fVar207;
        fVar159 = fVar69 - fVar118;
        fVar160 = fVar70 - fVar114;
        fVar165 = fVar71 - fVar135;
        fVar131 = fVar206 * fVar122 * (fVar214 * fVar131 - fVar72 * fVar171) * fVar207 +
                  fVar68 * fVar171 * fVar207;
        fVar133 = fVar206 * fVar122 * (fVar214 * fVar133 - fVar72 * fVar172) * fVar207 +
                  fVar68 * fVar172 * fVar207;
        fVar194 = fVar206 * fVar122 * (fVar214 * fVar120 - fVar72 * fVar194) * fVar207 +
                  fVar68 * fVar194 * fVar207;
        fVar122 = fVar170 * fVar106 * fVar221;
        fVar214 = fVar170 * fVar116 * fVar221;
        fVar207 = fVar170 * fVar220 * fVar221;
        fVar171 = fVar156 - fVar122;
        fVar172 = fVar157 - fVar214;
        fVar68 = fVar158 - fVar207;
        fVar106 = fVar170 * fVar213 * (fVar192 * fVar222 - fVar167 * fVar106) * fVar221 +
                  fVar73 * fVar106 * fVar221;
        fVar215 = fVar170 * fVar213 * (fVar192 * fVar215 - fVar167 * fVar116) * fVar221 +
                  fVar73 * fVar116 * fVar221;
        fVar220 = fVar170 * fVar213 * (fVar192 * fVar212 - fVar167 * fVar220) * fVar221 +
                  fVar73 * fVar220 * fVar221;
        fVar221 = (fVar183 - fVar131) * 0.33333334 + fVar159;
        fVar116 = (fVar28 - fVar133) * 0.33333334 + fVar160;
        fVar120 = (fVar29 - fVar194) * 0.33333334 + fVar165;
        fVar212 = fVar171 - (fVar191 - fVar106) * 0.33333334;
        fVar213 = fVar172 - (fVar193 - fVar215) * 0.33333334;
        fVar222 = fVar68 - (fVar223 - fVar220) * 0.33333334;
        lVar16 = 0;
        local_298._8_8_ = 0x7f8000007f800000;
        local_298._0_8_ = 0x7f8000007f800000;
        local_2a8._8_8_ = 0x7f8000007f800000;
        local_2a8._0_8_ = 0x7f8000007f800000;
        local_288._8_8_ = 0x7f8000007f800000;
        local_288._0_8_ = 0x7f8000007f800000;
        _local_278 = _DAT_01feba00;
        local_238 = _DAT_01feba00;
        auVar128 = _DAT_01feba00;
        do {
          uVar14 = (uint)lVar16;
          lVar20 = lVar16 * 4;
          fVar192 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
          fVar167 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
          fVar72 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
          fVar73 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
          lVar20 = lVar16 * 4;
          fVar149 = *(float *)(bezier_basis0 + lVar20 + 0x660);
          fVar170 = *(float *)(bezier_basis0 + lVar20 + 0x664);
          fVar180 = *(float *)(bezier_basis0 + lVar20 + 0x668);
          fVar181 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
          lVar20 = lVar16 * 4;
          fVar182 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
          fVar228 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
          fVar229 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
          fVar231 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
          lVar20 = lVar16 * 4;
          fVar206 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
          fVar10 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
          fVar11 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
          fVar12 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
          auVar127._0_4_ =
               fVar159 * fVar192 + fVar221 * fVar149 + fVar212 * fVar182 + fVar171 * fVar206;
          auVar127._4_4_ =
               fVar159 * fVar167 + fVar221 * fVar170 + fVar212 * fVar228 + fVar171 * fVar10;
          auVar127._8_4_ =
               fVar159 * fVar72 + fVar221 * fVar180 + fVar212 * fVar229 + fVar171 * fVar11;
          auVar127._12_4_ =
               fVar159 * fVar73 + fVar221 * fVar181 + fVar212 * fVar231 + fVar171 * fVar12;
          auVar152._0_4_ =
               fVar160 * fVar192 + fVar116 * fVar149 + fVar213 * fVar182 + fVar172 * fVar206;
          auVar152._4_4_ =
               fVar160 * fVar167 + fVar116 * fVar170 + fVar213 * fVar228 + fVar172 * fVar10;
          auVar152._8_4_ =
               fVar160 * fVar72 + fVar116 * fVar180 + fVar213 * fVar229 + fVar172 * fVar11;
          auVar152._12_4_ =
               fVar160 * fVar73 + fVar116 * fVar181 + fVar213 * fVar231 + fVar172 * fVar12;
          auVar177._0_4_ =
               fVar192 * fVar165 + fVar149 * fVar120 + fVar182 * fVar222 + fVar206 * fVar68;
          auVar177._4_4_ =
               fVar167 * fVar165 + fVar170 * fVar120 + fVar228 * fVar222 + fVar10 * fVar68;
          auVar177._8_4_ =
               fVar72 * fVar165 + fVar180 * fVar120 + fVar229 * fVar222 + fVar11 * fVar68;
          auVar177._12_4_ =
               fVar73 * fVar165 + fVar181 * fVar120 + fVar231 * fVar222 + fVar12 * fVar68;
          lVar20 = lVar16 * 4;
          fVar192 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
          fVar167 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
          fVar72 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
          fVar73 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
          lVar20 = lVar16 * 4;
          fVar149 = *(float *)(bezier_basis0 + lVar20 + 0x1870);
          fVar170 = *(float *)(bezier_basis0 + lVar20 + 0x1874);
          fVar180 = *(float *)(bezier_basis0 + lVar20 + 0x1878);
          fVar181 = *(float *)(bezier_basis0 + lVar20 + 0x187c);
          lVar20 = lVar16 * 4;
          fVar182 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
          fVar228 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
          fVar229 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
          fVar231 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
          lVar20 = lVar16 * 4;
          fVar206 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
          fVar10 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
          fVar11 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
          fVar12 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
          fVar119 = fVar159 * fVar192 + fVar221 * fVar149 + fVar212 * fVar182 + fVar171 * fVar206;
          fVar161 = fVar159 * fVar167 + fVar221 * fVar170 + fVar212 * fVar228 + fVar171 * fVar10;
          fVar166 = fVar159 * fVar72 + fVar221 * fVar180 + fVar212 * fVar229 + fVar171 * fVar11;
          fVar168 = fVar159 * fVar73 + fVar221 * fVar181 + fVar212 * fVar231 + fVar171 * fVar12;
          fVar91 = fVar160 * fVar192 + fVar116 * fVar149 + fVar213 * fVar182 + fVar172 * fVar206;
          fVar107 = fVar160 * fVar167 + fVar116 * fVar170 + fVar213 * fVar228 + fVar172 * fVar10;
          fVar115 = fVar160 * fVar72 + fVar116 * fVar180 + fVar213 * fVar229 + fVar172 * fVar11;
          fVar117 = fVar160 * fVar73 + fVar116 * fVar181 + fVar213 * fVar231 + fVar172 * fVar12;
          fVar192 = fVar192 * fVar165 + fVar149 * fVar120 + fVar182 * fVar222 + fVar206 * fVar68;
          fVar167 = fVar167 * fVar165 + fVar170 * fVar120 + fVar228 * fVar222 + fVar10 * fVar68;
          fVar72 = fVar72 * fVar165 + fVar180 * fVar120 + fVar229 * fVar222 + fVar11 * fVar68;
          fVar73 = fVar73 * fVar165 + fVar181 * fVar120 + fVar231 * fVar222 + fVar12 * fVar68;
          uVar24 = -(uint)(uVar14 == 0);
          uVar205 = -(uint)(uVar14 == 1);
          uVar121 = -(uint)(uVar14 == 2);
          uVar132 = -(uint)(uVar14 == 3);
          uVar134 = -(uint)(uVar14 == 7);
          uVar136 = -(uint)(uVar14 == 6);
          uVar137 = -(uint)(uVar14 == 5);
          uVar146 = -(uint)(uVar14 == 4);
          local_228._4_4_ = (float)(~uVar136 & (uint)fVar161) * 0.055555556 + auVar127._4_4_;
          local_228._0_4_ = (float)(~uVar134 & (uint)fVar119) * 0.055555556 + auVar127._0_4_;
          fStack_220 = (float)(~uVar137 & (uint)fVar166) * 0.055555556 + auVar127._8_4_;
          fStack_21c = (float)(~uVar146 & (uint)fVar168) * 0.055555556 + auVar127._12_4_;
          auVar74 = minps(local_288,auVar127);
          auVar173 = maxps(local_238,auVar127);
          auVar163._0_8_ =
               CONCAT44(auVar127._4_4_ - (float)(~uVar205 & (uint)fVar161) * 0.055555556,
                        auVar127._0_4_ - (float)(~uVar24 & (uint)fVar119) * 0.055555556);
          auVar163._8_4_ = auVar127._8_4_ - (float)(~uVar121 & (uint)fVar166) * 0.055555556;
          auVar163._12_4_ = auVar127._12_4_ - (float)(~uVar132 & (uint)fVar168) * 0.055555556;
          auVar199._0_4_ = (float)(~uVar134 & (uint)fVar91) * 0.055555556 + auVar152._0_4_;
          auVar199._4_4_ = (float)(~uVar136 & (uint)fVar107) * 0.055555556 + auVar152._4_4_;
          auVar199._8_4_ = (float)(~uVar137 & (uint)fVar115) * 0.055555556 + auVar152._8_4_;
          auVar199._12_4_ = (float)(~uVar146 & (uint)fVar117) * 0.055555556 + auVar152._12_4_;
          auVar216 = minps(local_2a8,auVar152);
          auVar139 = maxps(_local_278,auVar152);
          auVar153._0_8_ =
               CONCAT44(auVar152._4_4_ - (float)(~uVar205 & (uint)fVar107) * 0.055555556,
                        auVar152._0_4_ - (float)(~uVar24 & (uint)fVar91) * 0.055555556);
          auVar153._8_4_ = auVar152._8_4_ - (float)(~uVar121 & (uint)fVar115) * 0.055555556;
          auVar153._12_4_ = auVar152._12_4_ - (float)(~uVar132 & (uint)fVar117) * 0.055555556;
          auVar110._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar110._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar110._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar110._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar218._0_4_ = (float)(~uVar134 & (uint)fVar192) * 0.055555556 + auVar177._0_4_;
          auVar218._4_4_ = (float)(~uVar136 & (uint)fVar167) * 0.055555556 + auVar177._4_4_;
          auVar218._8_4_ = (float)(~uVar137 & (uint)fVar72) * 0.055555556 + auVar177._8_4_;
          auVar218._12_4_ = (float)(~uVar146 & (uint)fVar73) * 0.055555556 + auVar177._12_4_;
          auVar108 = minps(local_298,auVar177);
          auVar151 = maxps(auVar128,auVar177);
          auVar178._0_8_ =
               CONCAT44(auVar177._4_4_ - (float)(~uVar205 & (uint)fVar167) * 0.055555556,
                        auVar177._0_4_ - (float)(~uVar24 & (uint)fVar192) * 0.055555556);
          auVar178._8_4_ = auVar177._8_4_ - (float)(~uVar121 & (uint)fVar72) * 0.055555556;
          auVar178._12_4_ = auVar177._12_4_ - (float)(~uVar132 & (uint)fVar73) * 0.055555556;
          auVar188._8_4_ = auVar163._8_4_;
          auVar188._0_8_ = auVar163._0_8_;
          auVar188._12_4_ = auVar163._12_4_;
          auVar184 = minps(auVar188,_local_228);
          auVar184 = minps(auVar74,auVar184);
          auVar189._8_4_ = auVar153._8_4_;
          auVar189._0_8_ = auVar153._0_8_;
          auVar189._12_4_ = auVar153._12_4_;
          auVar74 = minps(auVar189,auVar199);
          auVar216 = minps(auVar216,auVar74);
          auVar190._8_4_ = auVar178._8_4_;
          auVar190._0_8_ = auVar178._0_8_;
          auVar190._12_4_ = auVar178._12_4_;
          auVar74 = minps(auVar190,auVar218);
          auVar74 = minps(auVar108,auVar74);
          auVar144._0_4_ = local_288._0_4_ & auVar110._0_4_;
          auVar144._4_4_ = local_288._4_4_ & auVar110._4_4_;
          auVar144._8_4_ = local_288._8_4_ & auVar110._8_4_;
          auVar144._12_4_ = local_288._12_4_ & auVar110._12_4_;
          local_288 = auVar144 | ~auVar110 & auVar184;
          uVar121 = local_2a8._0_4_ & auVar110._0_4_ | ~auVar110._0_4_ & auVar216._0_4_;
          uVar132 = local_2a8._4_4_ & auVar110._4_4_ | ~auVar110._4_4_ & auVar216._4_4_;
          uVar134 = local_2a8._8_4_ & auVar110._8_4_ | ~auVar110._8_4_ & auVar216._8_4_;
          local_2a8._12_4_ = local_2a8._12_4_ & auVar110._12_4_ | ~auVar110._12_4_ & auVar216._12_4_
          ;
          local_2a8._4_4_ = uVar132;
          local_2a8._0_4_ = uVar121;
          local_2a8._8_4_ = uVar134;
          uVar14 = local_298._0_4_ & auVar110._0_4_ | ~auVar110._0_4_ & auVar74._0_4_;
          uVar24 = local_298._4_4_ & auVar110._4_4_ | ~auVar110._4_4_ & auVar74._4_4_;
          uVar205 = local_298._8_4_ & auVar110._8_4_ | ~auVar110._8_4_ & auVar74._8_4_;
          local_298._12_4_ = local_298._12_4_ & auVar110._12_4_ | ~auVar110._12_4_ & auVar74._12_4_;
          local_298._4_4_ = uVar24;
          local_298._0_4_ = uVar14;
          local_298._8_4_ = uVar205;
          auVar74 = maxps(auVar163,_local_228);
          auVar74 = maxps(auVar173,auVar74);
          auVar173 = maxps(auVar153,auVar199);
          auVar173 = maxps(auVar139,auVar173);
          auVar108 = maxps(auVar178,auVar218);
          auVar108 = maxps(auVar151,auVar108);
          uVar136 = local_238._0_4_ & auVar110._0_4_ | ~auVar110._0_4_ & auVar74._0_4_;
          uVar137 = local_238._4_4_ & auVar110._4_4_ | ~auVar110._4_4_ & auVar74._4_4_;
          uVar146 = local_238._8_4_ & auVar110._8_4_ | ~auVar110._8_4_ & auVar74._8_4_;
          local_238._12_4_ = local_238._12_4_ & auVar110._12_4_ | ~auVar110._12_4_ & auVar74._12_4_;
          local_238._4_4_ = uVar137;
          local_238._0_4_ = uVar136;
          local_238._8_4_ = uVar146;
          uVar147 = local_278._0_4_ & auVar110._0_4_ | ~auVar110._0_4_ & auVar173._0_4_;
          uVar148 = local_278._4_4_ & auVar110._4_4_ | ~auVar110._4_4_ & auVar173._4_4_;
          uVar230 = local_278._8_4_ & auVar110._8_4_ | ~auVar110._8_4_ & auVar173._8_4_;
          fStack_26c = (float)(local_278._12_4_ & auVar110._12_4_ |
                              ~auVar110._12_4_ & auVar173._12_4_);
          local_278._4_4_ = uVar148;
          local_278._0_4_ = uVar147;
          fStack_270 = (float)uVar230;
          local_2b8._0_4_ = auVar128._0_4_;
          local_2b8._4_4_ = auVar128._4_4_;
          uStack_2b0._0_4_ = auVar128._8_4_;
          uStack_2b0._4_4_ = auVar128._12_4_;
          auVar48._0_4_ = local_2b8._0_4_ & auVar110._0_4_;
          auVar48._4_4_ = local_2b8._4_4_ & auVar110._4_4_;
          auVar48._8_4_ = (uint)(float)uStack_2b0 & auVar110._8_4_;
          auVar48._12_4_ = uStack_2b0._4_4_ & auVar110._12_4_;
          auVar128._4_4_ = ~auVar110._4_4_ & auVar108._4_4_;
          auVar128._0_4_ = ~auVar110._0_4_ & auVar108._0_4_;
          auVar128._8_4_ = ~auVar110._8_4_ & auVar108._8_4_;
          auVar128._12_4_ = ~auVar110._12_4_ & auVar108._12_4_;
          auVar128 = auVar128 | auVar48;
          lVar16 = lVar16 + 4;
        } while (lVar16 == 4);
        fVar69 = fVar69 + fVar118;
        fVar70 = fVar70 + fVar114;
        fVar71 = fVar71 + fVar135;
        fVar156 = fVar156 + fVar122;
        fVar157 = fVar157 + fVar214;
        fVar158 = fVar158 + fVar207;
        fVar212 = (fVar131 + fVar183) * 0.33333334 + fVar69;
        fVar213 = (fVar133 + fVar28) * 0.33333334 + fVar70;
        fVar222 = (fVar194 + fVar29) * 0.33333334 + fVar71;
        fVar122 = fVar156 - (fVar106 + fVar191) * 0.33333334;
        fVar214 = fVar157 - (fVar215 + fVar193) * 0.33333334;
        fVar207 = fVar158 - (fVar220 + fVar223) * 0.33333334;
        auVar49._4_4_ = local_288._0_4_;
        auVar49._0_4_ = local_288._4_4_;
        auVar49._8_4_ = local_288._12_4_;
        auVar49._12_4_ = local_288._8_4_;
        auVar74 = minps(auVar49,local_288);
        auVar82._0_8_ = auVar74._8_8_;
        auVar82._8_4_ = auVar74._0_4_;
        auVar82._12_4_ = auVar74._4_4_;
        auVar173 = minps(auVar82,auVar74);
        auVar50._4_4_ = uVar121;
        auVar50._0_4_ = uVar132;
        auVar50._8_4_ = local_2a8._12_4_;
        auVar50._12_4_ = uVar134;
        auVar74 = minps(auVar50,local_2a8);
        auVar99._0_8_ = auVar74._8_8_;
        auVar99._8_4_ = auVar74._0_4_;
        auVar99._12_4_ = auVar74._4_4_;
        auVar108 = minps(auVar99,auVar74);
        auVar51._4_4_ = uVar14;
        auVar51._0_4_ = uVar24;
        auVar51._8_4_ = local_298._12_4_;
        auVar51._12_4_ = uVar205;
        auVar74 = minps(auVar51,local_298);
        auVar52._0_8_ = auVar74._8_8_;
        auVar52._8_4_ = auVar74._0_4_;
        auVar52._12_4_ = auVar74._4_4_;
        auVar112._4_4_ = auVar108._0_4_;
        auVar112._0_4_ = auVar173._0_4_;
        auVar53._4_4_ = uVar136;
        auVar53._0_4_ = uVar137;
        auVar53._8_4_ = local_238._12_4_;
        auVar53._12_4_ = uVar146;
        auVar173 = maxps(auVar53,local_238);
        auVar83._0_8_ = auVar173._8_8_;
        auVar83._8_4_ = auVar173._0_4_;
        auVar83._12_4_ = auVar173._4_4_;
        auVar108 = maxps(auVar83,auVar173);
        auVar54._4_4_ = uVar147;
        auVar54._0_4_ = uVar148;
        auVar54._8_4_ = fStack_26c;
        auVar54._12_4_ = uVar230;
        auVar173 = maxps(auVar54,_local_278);
        auVar100._0_8_ = auVar173._8_8_;
        auVar100._8_4_ = auVar173._0_4_;
        auVar100._12_4_ = auVar173._4_4_;
        auVar139 = maxps(auVar100,auVar173);
        auVar55._4_4_ = auVar128._0_4_;
        auVar55._0_4_ = auVar128._4_4_;
        auVar55._8_4_ = auVar128._12_4_;
        auVar55._12_4_ = auVar128._8_4_;
        auVar173 = maxps(auVar55,auVar128);
        auVar56._0_8_ = auVar173._8_8_;
        auVar56._8_4_ = auVar173._0_4_;
        auVar56._12_4_ = auVar173._4_4_;
        auVar130._4_4_ = auVar139._0_4_;
        auVar130._0_4_ = auVar108._0_4_;
        lVar16 = 0;
        local_2a8._8_8_ = 0x7f8000007f800000;
        local_2a8._0_8_ = 0x7f8000007f800000;
        local_288._8_8_ = 0x7f8000007f800000;
        local_288._0_8_ = 0x7f8000007f800000;
        local_258._8_8_ = 0x7f8000007f800000;
        local_258._0_8_ = 0x7f8000007f800000;
        local_238 = _DAT_01feba00;
        local_298 = _DAT_01feba00;
        auVar145 = _DAT_01feba00;
        do {
          uVar14 = (uint)lVar16;
          lVar20 = lVar16 * 4;
          fVar215 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
          fVar220 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
          fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
          fVar118 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
          lVar20 = lVar16 * 4;
          fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x660);
          fVar114 = *(float *)(bezier_basis0 + lVar20 + 0x664);
          fVar116 = *(float *)(bezier_basis0 + lVar20 + 0x668);
          fVar135 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
          lVar20 = lVar16 * 4;
          fVar120 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
          fVar131 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
          fVar133 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
          fVar192 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
          lVar20 = lVar16 * 4;
          fVar194 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
          fVar159 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
          fVar160 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
          fVar165 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
          auVar57._0_4_ =
               fVar69 * fVar215 + fVar212 * fVar106 + fVar122 * fVar120 + fVar156 * fVar194;
          auVar57._4_4_ =
               fVar69 * fVar220 + fVar212 * fVar114 + fVar122 * fVar131 + fVar156 * fVar159;
          auVar57._8_4_ =
               fVar69 * fVar221 + fVar212 * fVar116 + fVar122 * fVar133 + fVar156 * fVar160;
          auVar57._12_4_ =
               fVar69 * fVar118 + fVar212 * fVar135 + fVar122 * fVar192 + fVar156 * fVar165;
          auVar203._0_4_ =
               fVar70 * fVar215 + fVar213 * fVar106 + fVar214 * fVar120 + fVar157 * fVar194;
          auVar203._4_4_ =
               fVar70 * fVar220 + fVar213 * fVar114 + fVar214 * fVar131 + fVar157 * fVar159;
          auVar203._8_4_ =
               fVar70 * fVar221 + fVar213 * fVar116 + fVar214 * fVar133 + fVar157 * fVar160;
          auVar203._12_4_ =
               fVar70 * fVar118 + fVar213 * fVar135 + fVar214 * fVar192 + fVar157 * fVar165;
          local_1d8._0_4_ =
               fVar215 * fVar71 + fVar106 * fVar222 + fVar120 * fVar207 + fVar194 * fVar158;
          local_1d8._4_4_ =
               fVar220 * fVar71 + fVar114 * fVar222 + fVar131 * fVar207 + fVar159 * fVar158;
          fStack_1d0 = fVar221 * fVar71 + fVar116 * fVar222 + fVar133 * fVar207 + fVar160 * fVar158;
          fStack_1cc = fVar118 * fVar71 + fVar135 * fVar222 + fVar192 * fVar207 + fVar165 * fVar158;
          lVar20 = lVar16 * 4;
          fVar215 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
          fVar220 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
          fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
          fVar118 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
          lVar20 = lVar16 * 4;
          fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x1870);
          fVar114 = *(float *)(bezier_basis0 + lVar20 + 0x1874);
          fVar116 = *(float *)(bezier_basis0 + lVar20 + 0x1878);
          fVar135 = *(float *)(bezier_basis0 + lVar20 + 0x187c);
          lVar20 = lVar16 * 4;
          fVar120 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
          fVar131 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
          fVar133 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
          fVar192 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
          lVar20 = lVar16 * 4;
          fVar194 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
          fVar159 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
          fVar160 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
          fVar165 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
          fVar28 = fVar69 * fVar215 + fVar212 * fVar106 + fVar122 * fVar120 + fVar156 * fVar194;
          fVar29 = fVar69 * fVar220 + fVar212 * fVar114 + fVar122 * fVar131 + fVar156 * fVar159;
          fVar68 = fVar69 * fVar221 + fVar212 * fVar116 + fVar122 * fVar133 + fVar156 * fVar160;
          fVar72 = fVar69 * fVar118 + fVar212 * fVar135 + fVar122 * fVar192 + fVar156 * fVar165;
          fVar167 = fVar70 * fVar215 + fVar213 * fVar106 + fVar214 * fVar120 + fVar157 * fVar194;
          fVar171 = fVar70 * fVar220 + fVar213 * fVar114 + fVar214 * fVar131 + fVar157 * fVar159;
          fVar172 = fVar70 * fVar221 + fVar213 * fVar116 + fVar214 * fVar133 + fVar157 * fVar160;
          fVar183 = fVar70 * fVar118 + fVar213 * fVar135 + fVar214 * fVar192 + fVar157 * fVar165;
          fVar215 = fVar215 * fVar71 + fVar106 * fVar222 + fVar120 * fVar207 + fVar194 * fVar158;
          fVar220 = fVar220 * fVar71 + fVar114 * fVar222 + fVar131 * fVar207 + fVar159 * fVar158;
          fVar221 = fVar221 * fVar71 + fVar116 * fVar222 + fVar133 * fVar207 + fVar160 * fVar158;
          fVar118 = fVar118 * fVar71 + fVar135 * fVar222 + fVar192 * fVar207 + fVar165 * fVar158;
          uVar134 = -(uint)(uVar14 == 0);
          uVar136 = -(uint)(uVar14 == 1);
          uVar137 = -(uint)(uVar14 == 2);
          uVar146 = -(uint)(uVar14 == 3);
          uVar24 = -(uint)(uVar14 == 7);
          uVar205 = -(uint)(uVar14 == 6);
          uVar121 = -(uint)(uVar14 == 5);
          uVar132 = -(uint)(uVar14 == 4);
          local_278._4_4_ = (float)(~uVar205 & (uint)fVar29) * 0.055555556 + auVar57._4_4_;
          local_278._0_4_ = (float)(~uVar24 & (uint)fVar28) * 0.055555556 + auVar57._0_4_;
          fStack_270 = (float)(~uVar121 & (uint)fVar68) * 0.055555556 + auVar57._8_4_;
          fStack_26c = (float)(~uVar132 & (uint)fVar72) * 0.055555556 + auVar57._12_4_;
          auVar139 = minps(local_258,auVar57);
          auVar184 = maxps(local_298,auVar57);
          auVar129._0_8_ =
               CONCAT44(auVar57._4_4_ - (float)(~uVar136 & (uint)fVar29) * 0.055555556,
                        auVar57._0_4_ - (float)(~uVar134 & (uint)fVar28) * 0.055555556);
          auVar129._8_4_ = auVar57._8_4_ - (float)(~uVar137 & (uint)fVar68) * 0.055555556;
          auVar129._12_4_ = auVar57._12_4_ - (float)(~uVar146 & (uint)fVar72) * 0.055555556;
          auVar179._0_4_ = (float)(~uVar24 & (uint)fVar167) * 0.055555556 + auVar203._0_4_;
          auVar179._4_4_ = (float)(~uVar205 & (uint)fVar171) * 0.055555556 + auVar203._4_4_;
          auVar179._8_4_ = (float)(~uVar121 & (uint)fVar172) * 0.055555556 + auVar203._8_4_;
          auVar179._12_4_ = (float)(~uVar132 & (uint)fVar183) * 0.055555556 + auVar203._12_4_;
          auVar216 = minps(local_288,auVar203);
          auVar226 = maxps(local_238,auVar203);
          auVar204._0_8_ =
               CONCAT44(auVar203._4_4_ - (float)(~uVar136 & (uint)fVar171) * 0.055555556,
                        auVar203._0_4_ - (float)(~uVar134 & (uint)fVar167) * 0.055555556);
          auVar204._8_4_ = auVar203._8_4_ - (float)(~uVar137 & (uint)fVar172) * 0.055555556;
          auVar204._12_4_ = auVar203._12_4_ - (float)(~uVar146 & (uint)fVar183) * 0.055555556;
          auVar111._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar111._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar111._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar111._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar14 ^ 0x80000000));
          auVar200._0_4_ = (float)(~uVar24 & (uint)fVar215) * 0.055555556 + (float)local_1d8._0_4_;
          auVar200._4_4_ = (float)(~uVar205 & (uint)fVar220) * 0.055555556 + (float)local_1d8._4_4_;
          auVar200._8_4_ = (float)(~uVar121 & (uint)fVar221) * 0.055555556 + fStack_1d0;
          auVar200._12_4_ = (float)(~uVar132 & (uint)fVar118) * 0.055555556 + fStack_1cc;
          auVar108 = minps(local_2a8,_local_1d8);
          auVar151 = maxps(auVar145,_local_1d8);
          auVar164._0_8_ =
               CONCAT44((float)local_1d8._4_4_ - (float)(~uVar136 & (uint)fVar220) * 0.055555556,
                        (float)local_1d8._0_4_ - (float)(~uVar134 & (uint)fVar215) * 0.055555556);
          auVar164._8_4_ = fStack_1d0 - (float)(~uVar137 & (uint)fVar221) * 0.055555556;
          auVar164._12_4_ = fStack_1cc - (float)(~uVar146 & (uint)fVar118) * 0.055555556;
          auVar209._8_4_ = auVar129._8_4_;
          auVar209._0_8_ = auVar129._0_8_;
          auVar209._12_4_ = auVar129._12_4_;
          auVar124 = minps(auVar209,_local_278);
          auVar139 = minps(auVar139,auVar124);
          auVar210._8_4_ = auVar204._8_4_;
          auVar210._0_8_ = auVar204._0_8_;
          auVar210._12_4_ = auVar204._12_4_;
          auVar124 = minps(auVar210,auVar179);
          auVar216 = minps(auVar216,auVar124);
          auVar211._8_4_ = auVar164._8_4_;
          auVar211._0_8_ = auVar164._0_8_;
          auVar211._12_4_ = auVar164._12_4_;
          auVar124 = minps(auVar211,auVar200);
          auVar108 = minps(auVar108,auVar124);
          auVar154._0_4_ = local_258._0_4_ & auVar111._0_4_;
          auVar154._4_4_ = local_258._4_4_ & auVar111._4_4_;
          auVar154._8_4_ = local_258._8_4_ & auVar111._8_4_;
          auVar154._12_4_ = local_258._12_4_ & auVar111._12_4_;
          local_258 = auVar154 | ~auVar111 & auVar139;
          auVar155._0_4_ = ~auVar111._0_4_ & auVar216._0_4_;
          auVar155._4_4_ = ~auVar111._4_4_ & auVar216._4_4_;
          auVar155._8_4_ = ~auVar111._8_4_ & auVar216._8_4_;
          auVar155._12_4_ = ~auVar111._12_4_ & auVar216._12_4_;
          auVar219._0_4_ = local_288._0_4_ & auVar111._0_4_;
          auVar219._4_4_ = local_288._4_4_ & auVar111._4_4_;
          auVar219._8_4_ = local_288._8_4_ & auVar111._8_4_;
          auVar219._12_4_ = local_288._12_4_ & auVar111._12_4_;
          local_288 = auVar219 | auVar155;
          uVar136 = local_2a8._0_4_ & auVar111._0_4_ | ~auVar111._0_4_ & auVar108._0_4_;
          uVar137 = local_2a8._4_4_ & auVar111._4_4_ | ~auVar111._4_4_ & auVar108._4_4_;
          uVar146 = local_2a8._8_4_ & auVar111._8_4_ | ~auVar111._8_4_ & auVar108._8_4_;
          local_2a8._12_4_ = local_2a8._12_4_ & auVar111._12_4_ | ~auVar111._12_4_ & auVar108._12_4_
          ;
          local_2a8._4_4_ = uVar137;
          local_2a8._0_4_ = uVar136;
          local_2a8._8_4_ = uVar146;
          auVar108 = maxps(auVar129,_local_278);
          auVar139 = maxps(auVar184,auVar108);
          auVar108 = maxps(auVar204,auVar179);
          auVar184 = maxps(auVar226,auVar108);
          auVar108 = maxps(auVar164,auVar200);
          auVar108 = maxps(auVar151,auVar108);
          uVar121 = local_298._0_4_ & auVar111._0_4_ | ~auVar111._0_4_ & auVar139._0_4_;
          uVar132 = local_298._4_4_ & auVar111._4_4_ | ~auVar111._4_4_ & auVar139._4_4_;
          uVar134 = local_298._8_4_ & auVar111._8_4_ | ~auVar111._8_4_ & auVar139._8_4_;
          local_298._12_4_ = local_298._12_4_ & auVar111._12_4_ | ~auVar111._12_4_ & auVar139._12_4_
          ;
          local_298._4_4_ = uVar132;
          local_298._0_4_ = uVar121;
          local_298._8_4_ = uVar134;
          uVar14 = local_238._0_4_ & auVar111._0_4_ | ~auVar111._0_4_ & auVar184._0_4_;
          uVar24 = local_238._4_4_ & auVar111._4_4_ | ~auVar111._4_4_ & auVar184._4_4_;
          uVar205 = local_238._8_4_ & auVar111._8_4_ | ~auVar111._8_4_ & auVar184._8_4_;
          local_238._12_4_ = local_238._12_4_ & auVar111._12_4_ | ~auVar111._12_4_ & auVar184._12_4_
          ;
          local_238._4_4_ = uVar24;
          local_238._0_4_ = uVar14;
          local_238._8_4_ = uVar205;
          local_2b8._0_4_ = auVar145._0_4_;
          local_2b8._4_4_ = auVar145._4_4_;
          uStack_2b0._0_4_ = auVar145._8_4_;
          uStack_2b0._4_4_ = auVar145._12_4_;
          auVar58._0_4_ = local_2b8._0_4_ & auVar111._0_4_;
          auVar58._4_4_ = local_2b8._4_4_ & auVar111._4_4_;
          auVar58._8_4_ = (uint)(float)uStack_2b0 & auVar111._8_4_;
          auVar58._12_4_ = uStack_2b0._4_4_ & auVar111._12_4_;
          auVar145._4_4_ = ~auVar111._4_4_ & auVar108._4_4_;
          auVar145._0_4_ = ~auVar111._0_4_ & auVar108._0_4_;
          auVar145._8_4_ = ~auVar111._8_4_ & auVar108._8_4_;
          auVar145._12_4_ = ~auVar111._12_4_ & auVar108._12_4_;
          auVar145 = auVar145 | auVar58;
          lVar16 = lVar16 + 4;
        } while (lVar16 == 4);
        auVar74 = minps(auVar52,auVar74);
        auVar112._8_4_ = auVar74._0_4_;
        auVar112._12_4_ = 0;
        auVar74 = maxps(auVar56,auVar173);
        auVar130._8_4_ = auVar74._0_4_;
        auVar130._12_4_ = 0;
        auVar59._4_4_ = local_258._0_4_;
        auVar59._0_4_ = local_258._4_4_;
        auVar59._8_4_ = local_258._12_4_;
        auVar59._12_4_ = local_258._8_4_;
        auVar74 = minps(auVar59,local_258);
        auVar101._0_8_ = auVar74._8_8_;
        auVar101._8_4_ = auVar74._0_4_;
        auVar101._12_4_ = auVar74._4_4_;
        auVar108 = minps(auVar101,auVar74);
        auVar60._4_4_ = local_288._0_4_;
        auVar60._0_4_ = local_288._4_4_;
        auVar60._8_4_ = local_288._12_4_;
        auVar60._12_4_ = local_288._8_4_;
        auVar74 = minps(auVar60,local_288);
        auVar84._0_8_ = auVar74._8_8_;
        auVar84._8_4_ = auVar74._0_4_;
        auVar84._12_4_ = auVar74._4_4_;
        auVar173 = minps(auVar84,auVar74);
        auVar61._4_4_ = uVar136;
        auVar61._0_4_ = uVar137;
        auVar61._8_4_ = local_2a8._12_4_;
        auVar61._12_4_ = uVar146;
        auVar74 = minps(auVar61,local_2a8);
        auVar102._0_8_ = auVar74._8_8_;
        auVar102._8_4_ = auVar74._0_4_;
        auVar102._12_4_ = auVar74._4_4_;
        auVar74 = minps(auVar102,auVar74);
        auVar85._4_4_ = auVar173._0_4_;
        auVar85._0_4_ = auVar108._0_4_;
        auVar85._8_4_ = auVar74._0_4_;
        auVar85._12_4_ = 0;
        auVar139 = minps(auVar112,auVar85);
        auVar62._4_4_ = uVar121;
        auVar62._0_4_ = uVar132;
        auVar62._8_4_ = local_298._12_4_;
        auVar62._12_4_ = uVar134;
        auVar74 = maxps(auVar62,local_298);
        auVar86._0_8_ = auVar74._8_8_;
        auVar86._8_4_ = auVar74._0_4_;
        auVar86._12_4_ = auVar74._4_4_;
        auVar173 = maxps(auVar86,auVar74);
        auVar63._4_4_ = uVar14;
        auVar63._0_4_ = uVar24;
        auVar63._8_4_ = local_238._12_4_;
        auVar63._12_4_ = uVar205;
        auVar74 = maxps(auVar63,local_238);
        auVar103._0_8_ = auVar74._8_8_;
        auVar103._8_4_ = auVar74._0_4_;
        auVar103._12_4_ = auVar74._4_4_;
        auVar108 = maxps(auVar103,auVar74);
        auVar64._4_4_ = auVar145._0_4_;
        auVar64._0_4_ = auVar145._4_4_;
        auVar64._8_4_ = auVar145._12_4_;
        auVar64._12_4_ = auVar145._8_4_;
        auVar74 = maxps(auVar64,auVar145);
        auVar87._0_8_ = auVar74._8_8_;
        auVar87._8_4_ = auVar74._0_4_;
        auVar87._12_4_ = auVar74._4_4_;
        auVar74 = maxps(auVar87,auVar74);
        auVar104._4_4_ = auVar108._0_4_;
        auVar104._0_4_ = auVar173._0_4_;
        auVar104._8_4_ = auVar74._0_4_;
        auVar104._12_4_ = 0;
        auVar173 = maxps(auVar130,auVar104);
        auVar65._0_8_ = auVar139._0_8_ & 0x7fffffff7fffffff;
        auVar65._8_4_ = ABS(auVar139._8_4_);
        auVar65._12_4_ = auVar139._12_4_ & 0x7fffffff;
        auVar88._0_8_ = auVar173._0_8_ & 0x7fffffff7fffffff;
        auVar88._8_4_ = ABS(auVar173._8_4_);
        auVar88._12_4_ = auVar173._12_4_ & 0x7fffffff;
        auVar74 = maxps(auVar65,auVar88);
        fVar122 = auVar74._4_4_;
        if (auVar74._4_4_ <= auVar74._0_4_) {
          fVar122 = auVar74._0_4_;
        }
        auVar66._8_8_ = auVar74._8_8_;
        auVar66._0_8_ = auVar74._8_8_;
        if (auVar74._8_4_ <= fVar122) {
          auVar66._0_4_ = fVar122;
        }
        fVar122 = auVar66._0_4_ * 4.7683716e-07;
        aVar113._0_4_ = auVar139._0_4_ - fVar122;
        aVar113._4_4_ = auVar139._4_4_ - fVar122;
        aVar113._8_4_ = auVar139._8_4_ - fVar122;
        aVar67._0_4_ = fVar122 + auVar173._0_4_;
        aVar67._4_4_ = fVar122 + auVar173._4_4_;
        aVar67._8_4_ = fVar122 + auVar173._8_4_;
        aVar113.m128[3] = (float)geomID;
        aVar67.m128[3] = (float)uVar22;
        auVar89._0_4_ = aVar113._0_4_ + aVar67._0_4_;
        auVar89._4_4_ = aVar113._4_4_ + aVar67._4_4_;
        auVar89._8_4_ = aVar113._8_4_ + aVar67._8_4_;
        auVar89._12_4_ = (float)geomID + (float)uVar22;
        local_a8 = minps(local_a8,auVar89);
        local_98 = maxps(local_98,auVar89);
        auVar90 = minps(auVar90,(undefined1  [16])aVar113);
        prims[local_b8].lower.field_0 = aVar113;
        auVar105 = maxps(auVar105,(undefined1  [16])aVar67);
        prims[local_b8].upper.field_0 = aVar67;
        local_d0 = local_d0 + 1;
        local_b8 = local_b8 + 1;
      }
LAB_00ab414a:
      uVar22 = uVar22 + 1;
    } while (uVar22 < r->_end);
  }
  else {
    local_98 = auVar105;
    local_a8 = auVar90;
  }
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar90;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar105;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_a8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_98._8_8_;
  __return_storage_ptr__->end = local_d0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }